

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

char * getLinkInterfaceDependentProperty<char_const*>
                 (cmGeneratorTarget *tgt,string *prop,string *config,CompatibleType t,char **param_5
                 )

{
  char *pcVar1;
  
  if (t - StringType < 3) {
    pcVar1 = checkInterfacePropertyCompatibility<char_const*>
                       (tgt,prop,config,"empty",t,(char **)0x0);
    return pcVar1;
  }
  if (t == BoolType) {
    __assert_fail("false && \"String compatibility check function called for boolean\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0xdff,
                  "const char *getLinkInterfaceDependentProperty(const cmGeneratorTarget *, const std::string &, const std::string &, CompatibleType, const char **)"
                 );
  }
  __assert_fail("false && \"Unreachable!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmGeneratorTarget.cxx"
                ,0xe08,
                "const char *getLinkInterfaceDependentProperty(const cmGeneratorTarget *, const std::string &, const std::string &, CompatibleType, const char **)"
               );
}

Assistant:

const char* getLinkInterfaceDependentProperty(cmGeneratorTarget const* tgt,
                                              const std::string& prop,
                                              const std::string& config,
                                              CompatibleType t,
                                              const char** /*unused*/)
{
  switch (t) {
    case BoolType:
      assert(false &&
             "String compatibility check function called for boolean");
      return CM_NULLPTR;
    case StringType:
      return tgt->GetLinkInterfaceDependentStringProperty(prop, config);
    case NumberMinType:
      return tgt->GetLinkInterfaceDependentNumberMinProperty(prop, config);
    case NumberMaxType:
      return tgt->GetLinkInterfaceDependentNumberMaxProperty(prop, config);
  }
  assert(false && "Unreachable!");
  return CM_NULLPTR;
}